

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O0

int print_insn_arg(char *d,uchar *buffer,uchar *p0,bfd_vma addr,disassemble_info *info)

{
  _Bool _Var1;
  bfd_vma bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  bfd_byte *local_e0;
  uint local_b4;
  int reg;
  short is_upper;
  int level;
  int fc;
  int break_reg;
  char *name;
  uint local_90;
  int first_regno_1;
  int newval_1;
  uint uStack_84;
  char doneany_1;
  int first_regno;
  int newval;
  char doneany;
  int val1;
  uint arch_mask;
  uint uval;
  bfd_signed_vma disp;
  int flt_p;
  double flval;
  uchar *p1;
  char *regname;
  uchar *puStack_48;
  int regno;
  uchar *p;
  int place;
  int val;
  disassemble_info *info_local;
  uchar *puStack_28;
  bfd_vma addr_local;
  uchar *p0_local;
  uchar *buffer_local;
  char *d_local;
  
  p._4_4_ = 0;
  p._0_4_ = (int)d[1];
  puStack_48 = p0;
  _place = info;
  info_local._4_4_ = addr;
  puStack_28 = p0;
  p0_local = buffer;
  buffer_local = (uchar *)d;
  switch(*d) {
  case '!':
  case '$':
  case '%':
  case '&':
  case '*':
  case '/':
  case '4':
  case ';':
  case '<':
  case '>':
  case '?':
  case '@':
  case 'b':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'v':
  case 'w':
  case 'y':
  case 'z':
  case '|':
  case '~':
    if ((int)p == 100) {
      uVar3 = fetch_arg(buffer,0x78,6,info);
      if ((int)uVar3 < 0) {
        return -3;
      }
      p._4_4_ = (uVar3 & 7) * 8 + ((int)uVar3 >> 3 & 7U);
    }
    else {
      p._4_4_ = fetch_arg(buffer,0x73,6,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
    }
    _Var1 = m68k_valid_ea(*buffer_local,p._4_4_);
    if (!_Var1) {
      return -1;
    }
    regname._4_4_ = p._4_4_ & 7 | 8;
    p1 = (uchar *)reg_names[(int)regname._4_4_];
    switch((int)p._4_4_ >> 3) {
    case 0:
      (*_place->fprintf_func)(_place->stream,"%s",reg_names[(int)p._4_4_]);
      break;
    case 1:
      (*_place->fprintf_func)(_place->stream,"%s",p1);
      break;
    case 2:
      (*_place->fprintf_func)(_place->stream,"(%s)",p1);
      break;
    case 3:
      (*_place->fprintf_func)(_place->stream,"(%s)+",p1);
      break;
    case 4:
      (*_place->fprintf_func)(_place->stream,"-(%s)",p1);
      break;
    case 5:
      puStack_48 = puStack_48 + 2;
      if ((*_place->private_data < puStack_48) &&
         (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
        return -3;
      }
      p._4_4_ = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
      if (dump_baserel == 0) {
        (*_place->fprintf_func)(_place->stream,"%d(%s)",(ulong)p._4_4_,p1);
      }
      else {
        (*_place->fprintf_func)(_place->stream,"(");
        print_base(regname._4_4_,p._4_4_,_place);
        (*_place->fprintf_func)(_place->stream,")");
      }
      break;
    case 6:
      puStack_48 = print_indexed(regname._4_4_,puStack_48,info_local._4_4_,_place);
      if (puStack_48 == (uchar *)0x0) {
        return -3;
      }
      break;
    case 7:
      switch(p._4_4_ & 7) {
      case 0:
        puStack_48 = puStack_48 + 2;
        if ((*_place->private_data < puStack_48) &&
           (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
          return -3;
        }
        p._4_4_ = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
        _place->target = p._4_4_;
        (*_place->print_address_func)(p._4_4_ & 0xffff,_place);
        break;
      case 1:
        puStack_48 = puStack_48 + 4;
        if ((*_place->private_data < puStack_48) &&
           (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
          return -3;
        }
        bVar2 = (((uint)puStack_48[-4] * 0x100 + (uint)puStack_48[-3]) * 0x100 +
                (uint)puStack_48[-2]) * 0x100 + (uint)puStack_48[-1];
        _place->target = bVar2;
        (*_place->print_address_func)(bVar2,_place);
        break;
      case 2:
        puStack_48 = puStack_48 + 2;
        if ((*_place->private_data < puStack_48) &&
           (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
          return -3;
        }
        p._4_4_ = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
        _place->target = info_local._4_4_ + p._4_4_;
        (*_place->print_address_func)(info_local._4_4_ + p._4_4_,_place);
        (*_place->fprintf_func)(_place->stream,"(pc)");
        break;
      case 3:
        puStack_48 = print_indexed(-1,puStack_48,info_local._4_4_,_place);
        if (puStack_48 == (uchar *)0x0) {
          return -3;
        }
        break;
      case 4:
        bVar6 = true;
        switch((int)p) {
        case 0x46:
          puStack_48 = puStack_48 + 8;
          if ((*_place->private_data < puStack_48) &&
             (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
            return -3;
          }
          floatformat_to_double(&floatformat_ieee_double_big,puStack_48 + -8,(double *)&disp);
          break;
        default:
          return -1;
        case 0x62:
          puStack_48 = puStack_48 + 2;
          if ((*_place->private_data < puStack_48) &&
             (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
            return -3;
          }
          p._4_4_ = (uint)(char)puStack_48[-1];
          bVar6 = false;
          break;
        case 0x66:
          puStack_48 = puStack_48 + 4;
          if ((*_place->private_data < puStack_48) &&
             (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
            return -3;
          }
          floatformat_to_double(&floatformat_ieee_single_big,puStack_48 + -4,(double *)&disp);
          break;
        case 0x6c:
          puStack_48 = puStack_48 + 4;
          if ((*_place->private_data < puStack_48) &&
             (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
            return -3;
          }
          p._4_4_ = ((((uint)puStack_48[-4] * 0x100 + (uint)puStack_48[-3]) * 0x100 +
                     (uint)puStack_48[-2]) * 0x100 + (uint)puStack_48[-1] ^ 0x80000000) + 0x80000000
          ;
          bVar6 = false;
          break;
        case 0x70:
          puStack_48 = puStack_48 + 0xc;
          if ((*_place->private_data < puStack_48) &&
             (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
            return -3;
          }
          _disp = 0.0;
          break;
        case 0x77:
          puStack_48 = puStack_48 + 2;
          if ((*_place->private_data < puStack_48) &&
             (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
            return -3;
          }
          p._4_4_ = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
          bVar6 = false;
          break;
        case 0x78:
          puStack_48 = puStack_48 + 0xc;
          if ((*_place->private_data < puStack_48) &&
             (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
            return -3;
          }
          floatformat_to_double(&floatformat_m68881_ext,puStack_48 + -0xc,(double *)&disp);
        }
        if (bVar6) {
          (*_place->fprintf_func)(_place->stream,"#<fixme>");
        }
        else {
          (*_place->fprintf_func)(_place->stream,"#%d",(ulong)p._4_4_);
        }
        break;
      default:
        return -1;
      }
    }
    if ((int)p == 0x2f) {
      p._4_4_ = fetch_arg(p0_local,0x2f,1,_place);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
      if (p._4_4_ != 0) {
        (*_place->fprintf_func)(_place->stream,"&");
      }
    }
    break;
  default:
    return -2;
  case '#':
  case '^':
    iVar4 = 4;
    if (*d == '#') {
      iVar4 = 2;
    }
    flval = (double)(buffer + iVar4);
    if ((int)p == 0x73) {
      p._4_4_ = fetch_arg(buffer,0x73,4,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
    }
    else if ((int)p == 0x43) {
      p._4_4_ = fetch_arg(buffer,0x43,7,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
    }
    else if ((int)p == 0x38) {
      p._4_4_ = fetch_arg(buffer,0x38,3,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
    }
    else if ((int)p == 0x33) {
      p._4_4_ = fetch_arg(buffer,0x33,8,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
    }
    else if ((int)p == 0x62) {
      flval = (double)((long)flval + 2);
      if ((*info->private_data < (ulong)flval) &&
         (iVar4 = fetch_data(info,(bfd_byte *)flval), iVar4 == 0)) {
        return -3;
      }
      p._4_4_ = (uint)*(char *)((long)flval + -1);
    }
    else if (((int)p == 0x77) || ((int)p == 0x57)) {
      flval = (double)((long)flval + 2);
      if ((*info->private_data < (ulong)flval) &&
         (iVar4 = fetch_data(info,(bfd_byte *)flval), iVar4 == 0)) {
        return -3;
      }
      p._4_4_ = ((uint)*(byte *)((long)flval + -2) * 0x100 + (uint)*(byte *)((long)flval + -1) ^
                0x8000) - 0x8000;
    }
    else {
      if ((int)p != 0x6c) {
        return -2;
      }
      flval = (double)((long)flval + 4);
      if ((*info->private_data < (ulong)flval) &&
         (iVar4 = fetch_data(info,(bfd_byte *)flval), iVar4 == 0)) {
        return -3;
      }
      p._4_4_ = ((((uint)*(byte *)((long)flval + -4) * 0x100 + (uint)*(byte *)((long)flval + -3)) *
                  0x100 + (uint)*(byte *)((long)flval + -2)) * 0x100 +
                 (uint)*(byte *)((long)flval + -1) ^ 0x80000000) + 0x80000000;
    }
    (*_place->fprintf_func)(_place->stream,"#%d",(ulong)p._4_4_);
    break;
  case '+':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"(%s)+",reg_names[(int)(p._4_4_ + 8)]);
    break;
  case '-':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"-(%s)",reg_names[(int)(p._4_4_ + 8)]);
    break;
  case 'A':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%s",reg_names[(int)(p._4_4_ + 8)]);
    break;
  case 'B':
    if ((int)p == 0x62) {
      puStack_48 = p0 + 2;
      if ((*info->private_data < puStack_48) && (iVar4 = fetch_data(info,puStack_48), iVar4 == 0)) {
        return -3;
      }
      arch_mask = (uint)(char)puStack_48[-1];
    }
    else if ((int)p == 0x42) {
      arch_mask = (uint)(char)buffer[1];
    }
    else if (((int)p == 0x77) || ((int)p == 0x57)) {
      puStack_48 = p0 + 2;
      if ((*info->private_data < puStack_48) && (iVar4 = fetch_data(info,puStack_48), iVar4 == 0)) {
        return -3;
      }
      arch_mask = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
    }
    else if ((((int)p == 0x6c) || ((int)p == 0x4c)) || ((int)p == 0x43)) {
      puStack_48 = p0 + 4;
      if ((*info->private_data < puStack_48) && (iVar4 = fetch_data(info,puStack_48), iVar4 == 0)) {
        return -3;
      }
      arch_mask = ((((uint)puStack_48[-4] * 0x100 + (uint)puStack_48[-3]) * 0x100 +
                   (uint)puStack_48[-2]) * 0x100 + (uint)puStack_48[-1] ^ 0x80000000) + 0x80000000;
    }
    else if ((int)p == 0x67) {
      p0_local = buffer + 2;
      if ((*info->private_data < p0_local) && (iVar4 = fetch_data(info,p0_local), iVar4 == 0)) {
        return -3;
      }
      arch_mask = (uint)(char)p0_local[-1];
      if (arch_mask == 0) {
        puStack_48 = puStack_48 + 2;
        if ((*_place->private_data < puStack_48) &&
           (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
          return -3;
        }
        arch_mask = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
      }
      else if (arch_mask == 0xffffffff) {
        puStack_48 = puStack_48 + 4;
        if ((*_place->private_data < puStack_48) &&
           (iVar4 = fetch_data(_place,puStack_48), iVar4 == 0)) {
          return -3;
        }
        arch_mask = ((((uint)puStack_48[-4] * 0x100 + (uint)puStack_48[-3]) * 0x100 +
                     (uint)puStack_48[-2]) * 0x100 + (uint)puStack_48[-1] ^ 0x80000000) + 0x80000000
        ;
      }
    }
    else {
      if ((int)p != 99) {
        return -2;
      }
      if ((buffer[1] & 0x40) == 0) {
        puStack_48 = p0 + 2;
        if ((*info->private_data < puStack_48) && (iVar4 = fetch_data(info,puStack_48), iVar4 == 0))
        {
          return -3;
        }
        arch_mask = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
      }
      else {
        puStack_48 = p0 + 4;
        if ((*info->private_data < puStack_48) && (iVar4 = fetch_data(info,puStack_48), iVar4 == 0))
        {
          return -3;
        }
        arch_mask = ((((uint)puStack_48[-4] * 0x100 + (uint)puStack_48[-3]) * 0x100 +
                     (uint)puStack_48[-2]) * 0x100 + (uint)puStack_48[-1] ^ 0x80000000) + 0x80000000
        ;
      }
    }
    _place->target = info_local._4_4_ + arch_mask;
    (*_place->print_address_func)(info_local._4_4_ + arch_mask,_place);
    break;
  case 'C':
    (*info->fprintf_func)(info->stream,"ccr");
    break;
  case 'D':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%s",reg_names[(int)p._4_4_]);
    break;
  case 'E':
    (*info->fprintf_func)(info->stream,"acc");
    break;
  case 'F':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"fp%d",(ulong)p._4_4_);
    break;
  case 'G':
    (*info->fprintf_func)(info->stream,"macsr");
    break;
  case 'H':
    (*info->fprintf_func)(info->stream,"mask");
    break;
  case 'I':
    p._4_4_ = fetch_arg(buffer,100,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    if (p._4_4_ != 1) {
      (*_place->fprintf_func)(_place->stream,"(cpid=%d) ",(ulong)p._4_4_);
    }
    break;
  case 'J':
    uVar3 = bfd_m68k_mach_to_features((int)info->mach);
    p._4_4_ = fetch_arg(p0_local,(int)p,0xc,_place);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    if ((uVar3 & 0x30000) != 0) {
      regname._4_4_ = 6;
      do {
        regname._4_4_ = regname._4_4_ + -1;
        if ((int)regname._4_4_ < 0) goto LAB_0013290e;
      } while (print_insn_arg::names_v4e[(int)regname._4_4_].value != p._4_4_);
      (*_place->fprintf_func)
                (_place->stream,"%s",print_insn_arg::names_v4e[(int)regname._4_4_].name);
LAB_0013290e:
      if (-1 < (int)regname._4_4_) break;
    }
    for (regname._4_4_ = 0xf; -1 < (int)regname._4_4_; regname._4_4_ = regname._4_4_ + -1) {
      if (print_insn_arg::names[(int)regname._4_4_].value == p._4_4_) {
        (*_place->fprintf_func)(_place->stream,"%s",print_insn_arg::names[(int)regname._4_4_].name);
        break;
      }
    }
    if ((int)regname._4_4_ < 0) {
      (*_place->fprintf_func)(_place->stream,"%d",(ulong)p._4_4_);
    }
    break;
  case 'K':
    p._4_4_ = fetch_arg(buffer,(int)p,9,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"#%d",(ulong)p._4_4_);
    break;
  case 'L':
  case 'l':
    if ((int)p == 0x77) {
      flval = (double)(buffer + 4);
      if ((*info->private_data < (ulong)flval) &&
         (iVar4 = fetch_data(info,(bfd_byte *)flval), iVar4 == 0)) {
        return -3;
      }
      p._4_4_ = ((uint)*(byte *)((long)flval + -2) * 0x100 + (uint)*(byte *)((long)flval + -1) ^
                0x8000) - 0x8000;
      if (puStack_48 < (ulong)flval) {
        local_e0 = (bfd_byte *)flval;
      }
      else {
        local_e0 = puStack_48;
      }
      puStack_48 = local_e0;
      if (p._4_4_ == 0) {
        (*_place->fprintf_func)(_place->stream,"#0");
      }
      else {
        if (*buffer_local == 'l') {
          uStack_84 = 0;
          for (regname._4_4_ = 0; (int)regname._4_4_ < 0x10; regname._4_4_ = regname._4_4_ + 1) {
            if ((p._4_4_ & 0x8000 >> ((byte)regname._4_4_ & 0x1f)) != 0) {
              uStack_84 = 1 << ((byte)regname._4_4_ & 0x1f) | uStack_84;
            }
          }
          p._4_4_ = uStack_84;
        }
        p._4_4_ = p._4_4_ & 0xffff;
        bVar6 = false;
        for (regname._4_4_ = 0; (int)regname._4_4_ < 0x10; regname._4_4_ = regname._4_4_ + 1) {
          if ((p._4_4_ & 1 << ((byte)regname._4_4_ & 0x1f)) != 0) {
            if (bVar6) {
              (*_place->fprintf_func)(_place->stream,"/");
            }
            bVar6 = true;
            (*_place->fprintf_func)(_place->stream,"%s",reg_names[(int)regname._4_4_]);
            iVar4 = regname._4_4_;
            while ((p._4_4_ & 1 << ((char)regname._4_4_ + 1U & 0x1f)) != 0) {
              regname._4_4_ = regname._4_4_ + 1;
            }
            if (iVar4 < (int)regname._4_4_) {
              (*_place->fprintf_func)(_place->stream,"-%s",reg_names[(int)regname._4_4_]);
            }
          }
        }
      }
    }
    else if ((int)p == 0x33) {
      p._4_4_ = fetch_arg(buffer,0x33,8,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
      if (p._4_4_ == 0) {
        (*_place->fprintf_func)(_place->stream,"#0");
      }
      else {
        if (*buffer_local == 'l') {
          local_90 = 0;
          for (regname._4_4_ = 0; (int)regname._4_4_ < 8; regname._4_4_ = regname._4_4_ + 1) {
            if ((p._4_4_ & 0x80 >> ((byte)regname._4_4_ & 0x1f)) != 0) {
              local_90 = 1 << ((byte)regname._4_4_ & 0x1f) | local_90;
            }
          }
          p._4_4_ = local_90;
        }
        p._4_4_ = p._4_4_ & 0xff;
        bVar6 = false;
        for (regname._4_4_ = 0; (int)regname._4_4_ < 8; regname._4_4_ = regname._4_4_ + 1) {
          if ((p._4_4_ & 1 << ((byte)regname._4_4_ & 0x1f)) != 0) {
            if (bVar6) {
              (*_place->fprintf_func)(_place->stream,"/");
            }
            bVar6 = true;
            (*_place->fprintf_func)(_place->stream,"fp%d",(ulong)regname._4_4_);
            uVar3 = regname._4_4_;
            while ((p._4_4_ & 1 << ((char)regname._4_4_ + 1U & 0x1f)) != 0) {
              regname._4_4_ = regname._4_4_ + 1;
            }
            if ((int)uVar3 < (int)regname._4_4_) {
              (*_place->fprintf_func)(_place->stream,"-fp%d",(ulong)regname._4_4_);
            }
          }
        }
      }
    }
    else {
      if ((int)p != 0x38) {
        return -2;
      }
      p._4_4_ = fetch_arg(buffer,0x38,3,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
      (*_place->fprintf_func)(_place->stream,"%s",fpcr_names[(int)p._4_4_]);
    }
    break;
  case 'M':
    if ((int)p == 0x68) {
      p._4_4_ = fetch_arg(buffer,0x68,1,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
      (*_place->fprintf_func)(_place->stream,"%s",print_insn_arg::scalefactor_name[(int)p._4_4_]);
    }
    else {
      p._4_4_ = fetch_arg(buffer,(int)p,8,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
      if ((p._4_4_ & 0x80) != 0) {
        p._4_4_ = p._4_4_ - 0x100;
      }
      (*_place->fprintf_func)(_place->stream,"#%d",(ulong)p._4_4_);
    }
    break;
  case 'O':
    p._4_4_ = fetch_arg(buffer,(int)p,6,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    if ((p._4_4_ & 0x20) == 0) {
      (*_place->fprintf_func)(_place->stream,"%d",(ulong)p._4_4_);
    }
    else {
      (*_place->fprintf_func)(_place->stream,"%s",reg_names[(int)(p._4_4_ & 7)]);
    }
    break;
  case 'Q':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    if ((p._4_4_ == 0) && (buffer_local[1] != 's')) {
      p._4_4_ = 8;
    }
    (*_place->fprintf_func)(_place->stream,"#%d",(ulong)p._4_4_);
    break;
  case 'R':
    p._4_4_ = fetch_arg(buffer,(int)p,4,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%s",reg_names[(int)p._4_4_]);
    break;
  case 'S':
    (*info->fprintf_func)(info->stream,"sr");
    break;
  case 'T':
    p._4_4_ = fetch_arg(buffer,(int)p,4,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"#%d",(ulong)p._4_4_);
    break;
  case 'U':
    (*info->fprintf_func)(info->stream,"usp");
    break;
  case 'V':
    (*info->fprintf_func)(info->stream,"val");
    break;
  case 'X':
    p._0_4_ = 0x38;
  case '0':
  case '1':
  case '2':
  case '3':
  case 'W':
  case 'Y':
  case 'Z':
    _fc = (char *)0x0;
    p._4_4_ = fetch_arg(buffer,(int)p,5,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    switch(p._4_4_) {
    case 2:
      _fc = "tt0";
      break;
    case 3:
      _fc = "tt1";
      break;
    default:
      (*_place->fprintf_func)(_place->stream,"<mmu register %d>",(ulong)p._4_4_);
      break;
    case 0x10:
      _fc = "tc";
      break;
    case 0x11:
      _fc = "drp";
      break;
    case 0x12:
      _fc = "srp";
      break;
    case 0x13:
      _fc = "crp";
      break;
    case 0x14:
      _fc = "cal";
      break;
    case 0x15:
      _fc = "val";
      break;
    case 0x16:
      _fc = "scc";
      break;
    case 0x17:
      _fc = "ac";
      break;
    case 0x18:
      _fc = "psr";
      break;
    case 0x19:
      _fc = "pcsr";
      break;
    case 0x1c:
    case 0x1d:
      pcVar5 = "bac%d";
      if (p._4_4_ == 0x1c) {
        pcVar5 = "bad%d";
      }
      (*_place->fprintf_func)(_place->stream,pcVar5,(ulong)((int)(uint)p0_local[3] >> 2 & 7));
    }
    if (_fc != (char *)0x0) {
      (*_place->fprintf_func)(_place->stream,"%s",_fc);
    }
    break;
  case '_':
    puStack_48 = p0 + 4;
    if ((*info->private_data < puStack_48) && (iVar4 = fetch_data(info,puStack_48), iVar4 == 0)) {
      return -3;
    }
    bVar2 = (((uint)puStack_48[-4] * 0x100 + (uint)puStack_48[-3]) * 0x100 + (uint)puStack_48[-2]) *
            0x100 + (uint)puStack_48[-1];
    _place->target = bVar2;
    (*_place->print_address_func)(bVar2,_place);
    break;
  case 'a':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"(%s)",reg_names[(int)(p._4_4_ + 8)]);
    break;
  case 'c':
    p._4_4_ = fetch_arg(buffer,(int)p,2,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%s",print_insn_arg::cacheFieldName[(int)p._4_4_]);
    break;
  case 'd':
    puStack_48 = p0 + 2;
    if ((*info->private_data < puStack_48) && (iVar4 = fetch_data(info,puStack_48), iVar4 == 0)) {
      return -3;
    }
    p._4_4_ = ((uint)puStack_48[-2] * 0x100 + (uint)puStack_48[-1] ^ 0x8000) - 0x8000;
    iVar4 = fetch_arg(p0_local,(int)p,3,_place);
    if (iVar4 < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%d(%s)",(ulong)p._4_4_,reg_names[iVar4 + 8]);
    break;
  case 'e':
    p._4_4_ = fetch_arg(buffer,(int)p,2,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%%acc%d",(ulong)p._4_4_);
    break;
  case 'f':
    uVar3 = fetch_arg(buffer,(int)p,5,info);
    if ((int)uVar3 < 0) {
      return -3;
    }
    if (uVar3 == 1) {
      (*_place->fprintf_func)(_place->stream,"dfc");
    }
    else if (uVar3 == 0) {
      (*_place->fprintf_func)(_place->stream,"sfc");
    }
    else {
      (*_place->fprintf_func)(_place->stream,"<function code %d>",(ulong)uVar3);
    }
    break;
  case 'g':
    p._4_4_ = fetch_arg(buffer,(int)p,1,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    pcVar5 = "23";
    if (p._4_4_ == 0) {
      pcVar5 = "01";
    }
    (*_place->fprintf_func)(_place->stream,"%%accext%s",pcVar5);
    break;
  case 'i':
    p._4_4_ = fetch_arg(buffer,(int)p,2,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    if (p._4_4_ == 1) {
      (*_place->fprintf_func)(_place->stream,"<<");
    }
    else {
      if (p._4_4_ != 3) {
        return -1;
      }
      (*_place->fprintf_func)(_place->stream,">>");
    }
    break;
  case 'j':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"#%d",(ulong)(p._4_4_ + 1));
    break;
  case 'k':
    if ((int)p == 0x6b) {
      p._4_4_ = fetch_arg(buffer,0x6b,3,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
      (*_place->fprintf_func)(_place->stream,"{%s}",reg_names[(int)p._4_4_]);
    }
    else {
      if ((int)p != 0x43) {
        return -1;
      }
      p._4_4_ = fetch_arg(buffer,0x43,7,info);
      if ((int)p._4_4_ < 0) {
        return -3;
      }
      if (0x3f < (int)p._4_4_) {
        p._4_4_ = p._4_4_ - 0x80;
      }
      (*_place->fprintf_func)(_place->stream,"{#%d}",(ulong)p._4_4_);
    }
    break;
  case 'r':
    regname._4_4_ = fetch_arg(buffer,(int)p,4,info);
    if ((int)regname._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"(%s)",reg_names[(int)regname._4_4_]);
    break;
  case 's':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%s",fpcr_names[(int)p._4_4_]);
    break;
  case 't':
    uVar3 = fetch_arg(buffer,(int)p,3,info);
    if ((int)uVar3 < 0) {
      return -3;
    }
    (*_place->fprintf_func)(_place->stream,"%d",(ulong)uVar3);
    break;
  case 'u':
    local_b4 = fetch_arg(buffer,(int)p,5,info);
    if ((int)local_b4 < 0) {
      return -3;
    }
    bVar6 = (local_b4 & 0x10) != 0;
    if (bVar6) {
      local_b4 = local_b4 & 0xf;
    }
    pcVar5 = "l";
    if (bVar6) {
      pcVar5 = "u";
    }
    (*_place->fprintf_func)(_place->stream,"%s%s",reg_half_names[(int)local_b4],pcVar5);
    break;
  case 'x':
    p._4_4_ = fetch_arg(buffer,(int)p,3,info);
    if ((int)p._4_4_ < 0) {
      return -3;
    }
    if (p._4_4_ == 0) {
      p._4_4_ = 0xffffffff;
    }
    (*_place->fprintf_func)(_place->stream,"#%d",(ulong)p._4_4_);
  }
  return (int)puStack_48 - (int)puStack_28;
}

Assistant:

static int
print_insn_arg (const char *d,
		unsigned char *buffer,
		unsigned char *p0,
		bfd_vma addr,
		disassemble_info *info)
{
  int val = 0;
  int place = d[1];
  unsigned char *p = p0;
  int regno;
  const char *regname;
  unsigned char *p1;
  double flval;
  int flt_p;
  bfd_signed_vma disp;
  unsigned int uval;

  switch (*d)
    {
    case 'c':		/* Cache identifier.  */
      {
        static char *const cacheFieldName[] = { "nc", "dc", "ic", "bc" };
        FETCH_ARG (2, val);
	(*info->fprintf_func) (info->stream, "%s", cacheFieldName[val]);
        break;
      }

    case 'a':		/* Address register indirect only. Cf. case '+'.  */
      {
	FETCH_ARG (3, val);
#ifdef MOTOROLA
	(*info->fprintf_func) (info->stream, "(%s)", reg_names[val + 8]);
#else
	(*info->fprintf_func) (info->stream, "%s@", reg_names[val + 8]);
#endif
        break;
      }

    case '_':		/* 32-bit absolute address for move16.  */
      {
        NEXTULONG (p, uval);
        info->target = uval;
	(*info->print_address_func) (uval, info);
        break;
      }

    case 'C':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "ccr");
#else
      (*info->fprintf_func) (info->stream, "%%ccr");
#endif
      break;

    case 'S':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "sr");
#else
      (*info->fprintf_func) (info->stream, "%%sr");
#endif
      break;

    case 'U':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "usp");
#else
      (*info->fprintf_func) (info->stream, "%%usp");
#endif
      break;

    case 'E':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "acc");
#else
      (*info->fprintf_func) (info->stream, "%%acc");
#endif
      break;

    case 'G':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "macsr");
#else
      (*info->fprintf_func) (info->stream, "%%macsr");
#endif
      break;

    case 'H':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "mask");
#else
      (*info->fprintf_func) (info->stream, "%%mask");
#endif
      break;

    case 'J':
      {
	/* FIXME: There's a problem here, different m68k processors call the
	   same address different names.  The tables below try to get it right
	   using info->mach, but only for v4e.  */
	struct regname { char * name; int value; };
#ifdef MOTOROLA
	static const struct regname names[] =
	  {
          {"sfc", 0x000},
          {"dfc", 0x001},
          {"cacr", 0x002},
          {"tc",  0x003},
          {"itt0",0x004},
          {"itt1", 0x005},
          {"dtt0",0x006},
          {"dtt1",0x007},
          // {"buscr",0x008},
          // {"rgpiobar", 0x009},
          // {"acr4",0x00c},
          // {"acr5",0x00d},
          // {"acr6",0x00e},
          // {"acr7", 0x00f},
          {"usp", 0x800},
          {"vbr", 0x801},
          {"caar", 0x802},
          {"msp", 0x803},
          {"isp", 0x804},
          // {"pc", 0x80f},
	    /* Reg c04 is sometimes called flashbar or rambar.
	       Reg c05 is also sometimes called rambar.  */
          // {"rambar0", 0xc04},
          // {"rambar1", 0xc05},

	    /* reg c0e is sometimes called mbar2 or secmbar.
	       reg c0f is sometimes called mbar.  */
          // {"mbar0", 0xc0e},
          // {"mbar1", 0xc0f},

	    /* Should we be calling this psr like we do in case 'Y'?  */
          {"mmusr",0x805},

          {"urp", 0x806},
          {"srp", 0x807},
          // {"pcr", 0x808},

	    /* Fido added these.  */
	    // {"cac", 0xffe},
        // {"mbo", 0xfff}
	};
	/* Alternate names for v4e (MCF5407/5445x/MCF547x/MCF548x), at least.  */
	static const struct regname names_v4e[] =
	  {
	    {"asid",0x003}, {"acr0",0x004}, {"acr1",0x005},
	    {"acr2",0x006}, {"acr3",0x007}, {"mmubar",0x008},
	  };
#else
	static const struct regname names[] =
	  {
	    {"%sfc", 0x000},
        {"%dfc", 0x001},
        {"%cacr", 0x002},
	    {"%tc",  0x003},
        {"%itt0",0x004},
        {"%itt1", 0x005},
	    {"%dtt0",0x006},
        {"%dtt1",0x007},
        // {"%buscr",0x008},
	    // {"%rgpiobar", 0x009},
        // {"%acr4",0x00c},
	    // {"%acr5",0x00d},
        // {"%acr6",0x00e},
        // {"%acr7", 0x00f},
	    {"%usp", 0x800},
        {"%vbr", 0x801},
        {"%caar", 0x802},
	    {"%msp", 0x803},
        {"%isp", 0x804},
	    // {"%pc", 0x80f},
	    /* Reg c04 is sometimes called flashbar or rambar.
	       Reg c05 is also sometimes called rambar.  */
	    // {"%rambar0", 0xc04},
        // {"%rambar1", 0xc05},

	    /* reg c0e is sometimes called mbar2 or secmbar.
	       reg c0f is sometimes called mbar.  */
	    // {"%mbar0", 0xc0e},
        // {"%mbar1", 0xc0f},

	    /* Should we be calling this psr like we do in case 'Y'?  */
	    {"%mmusr",0x805},

	    {"%urp", 0x806},
        {"%srp", 0x807},
        // {"%pcr", 0x808},

	    /* Fido added these.  */
	    // {"%cac", 0xffe},
        // {"%mbo", 0xfff}
	};
	/* Alternate names for v4e (MCF5407/5445x/MCF547x/MCF548x), at least.  */
	static const struct regname names_v4e[] =
	  {
	    {"%asid",0x003}, {"%acr0",0x004}, {"%acr1",0x005},
	    {"%acr2",0x006}, {"%acr3",0x007}, {"%mmubar",0x008},
	  };
#endif
	unsigned int arch_mask;

	arch_mask = bfd_m68k_mach_to_features (info->mach);
	FETCH_ARG (12, val);
	if (arch_mask & (mcfisa_b | mcfisa_c))
	  {
	    for (regno = ARRAY_SIZE (names_v4e); --regno >= 0;)
	      if (names_v4e[regno].value == val)
		{
		  (*info->fprintf_func) (info->stream, "%s", names_v4e[regno].name);
		  break;
		}
	    if (regno >= 0)
	      break;
	  }
	for (regno = ARRAY_SIZE (names) - 1; regno >= 0; regno--)
	  if (names[regno].value == val)
	    {
	      (*info->fprintf_func) (info->stream, "%s", names[regno].name);
	      break;
	    }
	if (regno < 0)
	  // (*info->fprintf_func) (info->stream, "0x%x", val); // DIRK: Replaced by...
        (*info->fprintf_func) (info->stream, "%d", val); // DIRK
      }
      break;

    case 'Q':
      FETCH_ARG (3, val);
      /* 0 means 8, except for the bkpt instruction... */
      if (val == 0 && d[1] != 's')
	val = 8;
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'x':
      FETCH_ARG (3, val);
      /* 0 means -1.  */
      if (val == 0)
	val = -1;
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'j':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "#%d", val+1);
      break;

    case 'K':
      FETCH_ARG (9, val);
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'M':
      if (place == 'h')
	{
	  static char *const scalefactor_name[] = { "<<", ">>" };

	  FETCH_ARG (1, val);
	  (*info->fprintf_func) (info->stream, "%s", scalefactor_name[val]);
	}
      else
	{
	  FETCH_ARG (8, val);
	  if (val & 0x80)
	    val = val - 0x100;
	  (*info->fprintf_func) (info->stream, "#%d", val);
	}
      break;

    case 'T':
      FETCH_ARG (4, val);
      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'D':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
      break;

    case 'A':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val + 010]);
      break;

    case 'R':
      FETCH_ARG (4, val);
      (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
      break;

    case 'r':
      FETCH_ARG (4, regno);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "(%s)", reg_names[regno]);
#else
      if (regno > 7)
	(*info->fprintf_func) (info->stream, "%s@", reg_names[regno]);
      else
	(*info->fprintf_func) (info->stream, "@(%s)", reg_names[regno]);
#endif
      break;

    case 'F':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "fp%d", val);
#else
      (*info->fprintf_func) (info->stream, "%%fp%d", val);
#endif
      break;

    case 'O':
      FETCH_ARG (6, val);
      if (val & 0x20)
	(*info->fprintf_func) (info->stream, "%s", reg_names[val & 7]);
      else
	(*info->fprintf_func) (info->stream, "%d", val);
      break;

    case '+':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "(%s)+", reg_names[val + 8]);
#else
      (*info->fprintf_func) (info->stream, "%s@+", reg_names[val + 8]);
#endif
      break;

    case '-':
      FETCH_ARG (3, val);
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "-(%s)", reg_names[val + 8]);
#else
      (*info->fprintf_func) (info->stream, "%s@-", reg_names[val + 8]);
#endif
      break;

    case 'k':
      if (place == 'k')
	{
	  FETCH_ARG (3, val);
	  (*info->fprintf_func) (info->stream, "{%s}", reg_names[val]);
	}
      else if (place == 'C')
	{
	  FETCH_ARG (7, val);
	  if (val > 63)		/* This is a signed constant.  */
	    val -= 128;
	  (*info->fprintf_func) (info->stream, "{#%d}", val);
	}
      else
	return PRINT_INSN_ARG_INVALID_OPERAND;
      break;

    case '#':
    case '^':
      p1 = buffer + (*d == '#' ? 2 : 4);
      if (place == 's')
	FETCH_ARG (4, val);
      else if (place == 'C')
	FETCH_ARG (7, val);
      else if (place == '8')
	FETCH_ARG (3, val);
      else if (place == '3')
	FETCH_ARG (8, val);
      else if (place == 'b')
	NEXTBYTE (p1, val);
      else if (place == 'w' || place == 'W')
	NEXTWORD (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'l')
	NEXTLONG (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
      else
	return PRINT_INSN_ARG_INVALID_OP_TABLE;

      (*info->fprintf_func) (info->stream, "#%d", val);
      break;

    case 'B':
      if (place == 'b')
	NEXTBYTE (p, disp);
      else if (place == 'B')
	disp = COERCE_SIGNED_CHAR (buffer[1]);
      else if (place == 'w' || place == 'W')
	NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'l' || place == 'L' || place == 'C')
	NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
      else if (place == 'g')
	{
	  NEXTBYTE (buffer, disp);
	  if (disp == 0)
	    NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	  else if (disp == -1)
	    NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	}
      else if (place == 'c')
	{
	  if (buffer[1] & 0x40)		/* If bit six is one, long offset.  */
	    NEXTLONG (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	  else
	    NEXTWORD (p, disp, PRINT_INSN_ARG_MEMORY_ERROR);
	}
      else
	return PRINT_INSN_ARG_INVALID_OP_TABLE;

      info->target = addr + disp;
      (*info->print_address_func) (addr + disp, info);
      break;

    case 'd':
      {
	int val1;

	NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
	FETCH_ARG (3, val1);
#ifdef MOTOROLA
	(*info->fprintf_func) (info->stream, "%d(%s)", val, reg_names[val1 + 8]);
#else
	(*info->fprintf_func) (info->stream, "%s@(%d)", reg_names[val1 + 8], val);
#endif
	break;
      }

    case 's':
      FETCH_ARG (3, val);
      (*info->fprintf_func) (info->stream, "%s", fpcr_names[val]);
      break;

    case 'e':
      FETCH_ARG (2, val);
      (*info->fprintf_func) (info->stream, "%%acc%d", val);
      break;

    case 'g':
      FETCH_ARG (1, val);
      (*info->fprintf_func) (info->stream, "%%accext%s", val == 0 ? "01" : "23");
      break;

    case 'i':
      FETCH_ARG (2, val);
      if (val == 1)
	(*info->fprintf_func) (info->stream, "<<");
      else if (val == 3)
	(*info->fprintf_func) (info->stream, ">>");
      else
	return PRINT_INSN_ARG_INVALID_OPERAND;
      break;

    case 'I':
      /* Get coprocessor ID... */
      val = fetch_arg (buffer, 'd', 3, info);
      if (val < 0)
	return PRINT_INSN_ARG_MEMORY_ERROR;
      if (val != 1)				/* Unusual coprocessor ID?  */
	(*info->fprintf_func) (info->stream, "(cpid=%d) ", val);
      break;

    case '4':
    case '*':
    case '~':
    case '%':
    case ';':
    case '@':
    case '!':
    case '$':
    case '?':
    case '/':
    case '&':
    case '|':
    case '<':
    case '>':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'v':
    case 'b':
    case 'w':
    case 'y':
    case 'z':
      if (place == 'd')
	{
	  val = fetch_arg (buffer, 'x', 6, info);
	  if (val < 0)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	  val = ((val & 7) << 3) + ((val >> 3) & 7);
	}
      else
	{
	  val = fetch_arg (buffer, 's', 6, info);
	  if (val < 0)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	}

      /* If the <ea> is invalid for *d, then reject this match.  */
      if (!m68k_valid_ea (*d, val))
	return PRINT_INSN_ARG_INVALID_OPERAND;

      /* Get register number assuming address register.  */
      regno = (val & 7) + 8;
      regname = reg_names[regno];
      switch (val >> 3)
	{
	case 0:
	  (*info->fprintf_func) (info->stream, "%s", reg_names[val]);
	  break;

	case 1:
	  (*info->fprintf_func) (info->stream, "%s", regname);
	  break;

	case 2:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "(%s)", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@", regname);
#endif
	  break;

	case 3:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "(%s)+", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@+", regname);
#endif
	  break;

	case 4:
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "-(%s)", regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@-", regname);
#endif
	  break;

	case 5:
	  NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
#ifdef MOTOROLA
	  if (dump_baserel)
	    {
	      (*info->fprintf_func) (info->stream, "(");
	      print_base(regno, val, info);
	      (*info->fprintf_func) (info->stream, ")");
	    }
	  else
	    (*info->fprintf_func) (info->stream, "%d(%s)", val, regname);
#else
	  (*info->fprintf_func) (info->stream, "%s@(%d)", regname, val);
#endif
	  break;

	case 6:
	  p = print_indexed (regno, p, addr, info);
	  if (p == NULL)
	    return PRINT_INSN_ARG_MEMORY_ERROR;
	  break;

	case 7:
	  switch (val & 7)
	    {
	    case 0:
          NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
        info->target = val;
	      (*info->print_address_func) ((unsigned short)val, info); // DIRK: Added (unsigned short)
	      break;

	    case 1:
	      NEXTULONG (p, uval);
        info->target = uval;
	      (*info->print_address_func) (uval, info);
	      break;

	    case 2:
	      NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
        info->target = addr + val;
#ifdef MOTOROLA
	      (*info->print_address_func) (addr + val, info);
	      (*info->fprintf_func) (info->stream, "(pc)");
#else
	      (*info->fprintf_func) (info->stream, "%%pc@(");
	      (*info->print_address_func) (addr + val, info);
	      (*info->fprintf_func) (info->stream, ")");
#endif
	      break;

	    case 3:
	      p = print_indexed (-1, p, addr, info);
	      if (p == NULL)
		return PRINT_INSN_ARG_MEMORY_ERROR;
	      break;

	    case 4:
	      flt_p = 1;	/* Assume it's a float... */
	      switch (place)
	      {
		case 'b':
		  NEXTBYTE (p, val);
		  flt_p = 0;
		  break;

		case 'w':
		  NEXTWORD (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
		  flt_p = 0;
		  break;

		case 'l':
		  NEXTLONG (p, val, PRINT_INSN_ARG_MEMORY_ERROR);
		  flt_p = 0;
		  break;

		case 'f':
		  NEXTSINGLE (flval, p);
		  break;

		case 'F':
		  NEXTDOUBLE (flval, p);
		  break;

		case 'x':
		  NEXTEXTEND (flval, p);
		  break;

		case 'p':
		  NEXTPACKED (p, flval);
		  break;

		default:
		  return PRINT_INSN_ARG_INVALID_OPERAND;
	      }
	      if (flt_p)	/* Print a float? */
              (*info->fprintf_func) (info->stream, "#<fixme>"); //  "#0e%g", flval);  // DIRK: REMOVE ASAP
	      else
		(*info->fprintf_func) (info->stream, "#%d", val);
	      break;

	    default:
	      return PRINT_INSN_ARG_INVALID_OPERAND;
	    }
	}

      /* If place is '/', then this is the case of the mask bit for
	 mac/emac loads. Now that the arg has been printed, grab the
	 mask bit and if set, add a '&' to the arg.  */
      if (place == '/')
	{
	  FETCH_ARG (1, val);
	  if (val)
	    info->fprintf_func (info->stream, "&");
	}
      break;

    case 'L':
    case 'l':
	if (place == 'w')
	  {
	    char doneany;
	    p1 = buffer + 2;
	    NEXTWORD (p1, val, PRINT_INSN_ARG_MEMORY_ERROR);
	    /* Move the pointer ahead if this point is farther ahead
	       than the last.  */
	    p = p1 > p ? p1 : p;
	    if (val == 0)
	      {
		(*info->fprintf_func) (info->stream, "#0");
		break;
	      }
	    if (*d == 'l')
	      {
		int newval = 0;

		for (regno = 0; regno < 16; ++regno)
		  if (val & (0x8000 >> regno))
		    newval |= 1 << regno;
		val = newval;
	      }
	    val &= 0xffff;
	    doneany = 0;
	    for (regno = 0; regno < 16; ++regno)
	      if (val & (1 << regno))
		{
		  int first_regno;

		  if (doneany)
		    (*info->fprintf_func) (info->stream, "/");
		  doneany = 1;
		  (*info->fprintf_func) (info->stream, "%s", reg_names[regno]);
		  first_regno = regno;
		  while (val & (1 << (regno + 1)))
		    ++regno;
		  if (regno > first_regno)
		    (*info->fprintf_func) (info->stream, "-%s",
					   reg_names[regno]);
		}
	  }
	else if (place == '3')
	  {
	    /* `fmovem' insn.  */
	    char doneany;

	    FETCH_ARG (8, val);
	    if (val == 0)
	      {
		(*info->fprintf_func) (info->stream, "#0");
		break;
	      }
	    if (*d == 'l')
	      {
		int newval = 0;

		for (regno = 0; regno < 8; ++regno)
		  if (val & (0x80 >> regno))
		    newval |= 1 << regno;
		val = newval;
	      }
	    val &= 0xff;
	    doneany = 0;
	    for (regno = 0; regno < 8; ++regno)
	      if (val & (1 << regno))
		{
		  int first_regno;
		  if (doneany)
		    (*info->fprintf_func) (info->stream, "/");
		  doneany = 1;
#ifdef MOTOROLA
		  (*info->fprintf_func) (info->stream, "fp%d", regno);
#else
		  (*info->fprintf_func) (info->stream, "%%fp%d", regno);
#endif
		  first_regno = regno;
		  while (val & (1 << (regno + 1)))
		    ++regno;
		  if (regno > first_regno)
#ifdef MOTOROLA
		    (*info->fprintf_func) (info->stream, "-fp%d", regno);
#else
		    (*info->fprintf_func) (info->stream, "-%%fp%d", regno);
#endif
		}
	  }
	else if (place == '8')
	  {
	    FETCH_ARG (3, val);
	    /* fmoveml for FP status registers.  */
	    (*info->fprintf_func) (info->stream, "%s", fpcr_names[val]);
	  }
	else
	  return PRINT_INSN_ARG_INVALID_OP_TABLE;
      break;

    case 'X':
      place = '8';
      /* Fall through.  */
    case 'Y':
    case 'Z':
    case 'W':
    case '0':
    case '1':
    case '2':
    case '3':
      {
	char *name = 0;

	FETCH_ARG (5, val);
	switch (val)
	  {
#ifdef MOTOROLA
	  case 2: name = "tt0"; break;
	  case 3: name = "tt1"; break;
	  case 0x10: name = "tc"; break;
	  case 0x11: name = "drp"; break;
	  case 0x12: name = "srp"; break;
	  case 0x13: name = "crp"; break;
	  case 0x14: name = "cal"; break;
	  case 0x15: name = "val"; break;
	  case 0x16: name = "scc"; break;
	  case 0x17: name = "ac"; break;
 	  case 0x18: name = "psr"; break;
	  case 0x19: name = "pcsr"; break;
	  case 0x1c:
	  case 0x1d:
	    {
	      int break_reg = ((buffer[3] >> 2) & 7);

	      (*info->fprintf_func)
		(info->stream, val == 0x1c ? "bad%d" : "bac%d",
		 break_reg);
	    }
#else
	  case 2: name = "%tt0"; break;
	  case 3: name = "%tt1"; break;
	  case 0x10: name = "%tc"; break;
	  case 0x11: name = "%drp"; break;
	  case 0x12: name = "%srp"; break;
	  case 0x13: name = "%crp"; break;
	  case 0x14: name = "%cal"; break;
	  case 0x15: name = "%val"; break;
	  case 0x16: name = "%scc"; break;
	  case 0x17: name = "%ac"; break;
 	  case 0x18: name = "%psr"; break;
	  case 0x19: name = "%pcsr"; break;
	  case 0x1c:
	  case 0x1d:
	    {
	      int break_reg = ((buffer[3] >> 2) & 7);

	      (*info->fprintf_func)
		(info->stream, val == 0x1c ? "%%bad%d" : "%%bac%d",
		 break_reg);
	    }
#endif
	    break;
	  default:
	    (*info->fprintf_func) (info->stream, "<mmu register %d>", val);
	  }
	if (name)
	  (*info->fprintf_func) (info->stream, "%s", name);
      }
      break;

    case 'f':
      {
	int fc;

	FETCH_ARG (5, fc);
	if (fc == 1)
#ifdef MOTOROLA
	  (*info->fprintf_func) (info->stream, "dfc");
	else if (fc == 0)
	  (*info->fprintf_func) (info->stream, "sfc");
#else
	  (*info->fprintf_func) (info->stream, "%%dfc");
	else if (fc == 0)
	  (*info->fprintf_func) (info->stream, "%%sfc");
#endif
	else
	  /* xgettext:c-format */
	  (*info->fprintf_func) (info->stream, _("<function code %d>"), fc);
      }
      break;

    case 'V':
#ifdef MOTOROLA
      (*info->fprintf_func) (info->stream, "val");
#else
      (*info->fprintf_func) (info->stream, "%%val");
#endif
      break;

    case 't':
      {
	int level;

	FETCH_ARG (3, level);
	(*info->fprintf_func) (info->stream, "%d", level);
      }
      break;

    case 'u':
      {
	short is_upper = 0;
	int reg;

	FETCH_ARG (5, reg);
	if (reg & 0x10)
	  {
	    is_upper = 1;
	    reg &= 0xf;
	  }
	(*info->fprintf_func) (info->stream, "%s%s",
			       reg_half_names[reg],
			       is_upper ? "u" : "l");
      }
      break;

    default:
      return PRINT_INSN_ARG_INVALID_OP_TABLE;
    }

  return p - p0;
}